

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNAccu.cpp
# Opt level: O3

void __thiscall NaPNAccumulator::action(NaPNAccumulator *this)

{
  NaReal NVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  NaReal *pNVar5;
  NaVector *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NaVector *pNVar7;
  undefined4 extraout_var_01;
  
  iVar3 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x16])();
  if (iVar3 == 0) {
    pNVar7 = NaPetriCnInput::data(&this->in);
    iVar3 = (*pNVar7->_vptr_NaVector[8])(pNVar7,0);
    this->fSum = *(double *)CONCAT44(extraout_var_00,iVar3) + this->fSum;
  }
  else {
    pNVar7 = &this->vBuffer;
    pNVar5 = NaVector::operator[](pNVar7,this->iNext);
    this->fSum = this->fSum - *pNVar5;
    pNVar6 = NaPetriCnInput::data(&this->in);
    iVar3 = (*pNVar6->_vptr_NaVector[8])(pNVar6,0);
    NVar1 = *(NaReal *)CONCAT44(extraout_var,iVar3);
    pNVar5 = NaVector::operator[](pNVar7,this->iNext);
    *pNVar5 = NVar1;
    pNVar5 = NaVector::operator[](pNVar7,this->iNext);
    this->fSum = *pNVar5 + this->fSum;
    uVar2 = this->iNext;
    uVar4 = NaVector::dim(pNVar7);
    if (uVar2 < uVar4 - 1) {
      this->iNext = this->iNext + 1;
    }
    else {
      this->iNext = 0;
    }
  }
  NVar1 = this->fSum;
  pNVar7 = NaPetriCnOutput::data(&this->sum);
  iVar3 = (*pNVar7->_vptr_NaVector[8])(pNVar7,0);
  *(NaReal *)CONCAT44(extraout_var_01,iVar3) = NVar1;
  return;
}

Assistant:

void
NaPNAccumulator::action ()
{
    if(get_accum_depth() > 0) {
#ifdef Accum_DEBUG
	NaPrintLog("------------------------------------------------\n"\
		   "begin: iNext=%u  fSum=%g  vBuffer:\n", iNext, fSum);
	vBuffer.print_contents();

	NaPrintLog("depth=%u input=%g\n", get_accum_depth(), in.data()[0]);
#endif // Accum_DEBUG

	fSum -= vBuffer[iNext];

	vBuffer[iNext] = in.data()[0];
#ifdef Accum_DEBUG
	NaPrintLog("intermeadiate: fSum=%g -> %g\n",
		   fSum, fSum + vBuffer[iNext]);
#endif // Accum_DEBUG

	fSum += vBuffer[iNext];
	if(iNext >= vBuffer.dim() - 1)
	    iNext = 0;
	else
	    ++iNext;

#ifdef Accum_DEBUG
	NaPrintLog("end:   iNext=%u  fSum=%g  vBuffer:\n", iNext, fSum);
	vBuffer.print_contents();
#endif // Accum_DEBUG
    } else {
	fSum += in.data()[0];
    }

    sum.data()[0] = fSum;
}